

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PianoInput.cpp
# Opt level: O2

void __thiscall PianoInput::mapBindings(PianoInput *this)

{
  long lVar1;
  int iVar2;
  int i;
  int iVar3;
  long lVar4;
  long lVar5;
  anon_class_8_1_8991fb9c mapKey;
  int local_38 [2];
  
  QHash<int,_int>::clear(&this->mBindingLookup);
  local_38[0] = 0;
  local_38[1] = 0xc;
  lVar5 = 8;
  mapKey.this = this;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 4) {
    iVar2 = *(int *)((long)local_38 + lVar4);
    for (iVar3 = 0; iVar3 != 0x18; iVar3 = iVar3 + 1) {
      lVar1 = lVar5 + -8;
      lVar5 = lVar5 + 4;
      mapBindings::anon_class_8_1_8991fb9c::operator()
                (&mapKey,*(Key *)((long)(this->mBindings)._M_elems + lVar1),iVar2 + iVar3);
    }
  }
  iVar2 = 0x24;
  for (; lVar5 != 0xcc; lVar5 = lVar5 + 4) {
    mapBindings::anon_class_8_1_8991fb9c::operator()
              (&mapKey,*(Key *)((long)(this->mBindings)._M_elems + lVar5 + -8),iVar2);
    iVar2 = iVar2 + 1;
  }
  return;
}

Assistant:

void PianoInput::mapBindings() {
    mBindingLookup.clear();

    auto mapKey = [this](Qt::Key key, int semitone) {
        if (key != NoKey) {
            mBindingLookup.insert(key, semitone);
        }
    };

    auto iter = mBindings.begin();
    // lower and upper rows (lower octave starts at 0, upper at 1)
    for (auto semitone : {0, 12}) {
        for (int i = 0; i < BindsPerRow; ++i) {
            mapKey(*iter++, semitone++);
        }
    }
    // specials
    int special = SPECIAL_START;
    while (iter != mBindings.end()) {
        mapKey(*iter++, special++);
    }

}